

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::ReportError(ValidateDSProcess *this,char *msg,...)

{
  char in_AL;
  DeadlyImportError *this_00;
  ulong uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d08 [16];
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  undefined8 local_cc8;
  undefined8 local_cb8;
  undefined8 local_ca8;
  undefined8 local_c98;
  undefined8 local_c88;
  undefined8 local_c78;
  undefined8 local_c68;
  undefined1 local_c55;
  allocator local_c41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  int local_bfc;
  char local_bf8 [4];
  int iLen;
  char szBuffer [3000];
  undefined4 local_38;
  undefined4 local_34;
  va_list args;
  char *msg_local;
  ValidateDSProcess *this_local;
  
  if (in_AL != '\0') {
    local_cd8 = in_XMM0_Qa;
    local_cc8 = in_XMM1_Qa;
    local_cb8 = in_XMM2_Qa;
    local_ca8 = in_XMM3_Qa;
    local_c98 = in_XMM4_Qa;
    local_c88 = in_XMM5_Qa;
    local_c78 = in_XMM6_Qa;
    local_c68 = in_XMM7_Qa;
  }
  local_cf8 = in_RDX;
  local_cf0 = in_RCX;
  local_ce8 = in_R8;
  local_ce0 = in_R9;
  if (msg != (char *)0x0) {
    args[0].overflow_arg_area = local_d08;
    args[0]._0_8_ = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x10;
    local_bfc = vsprintf(local_bf8,msg,&local_38);
    if (0 < local_bfc) {
      local_c55 = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      uVar1 = (ulong)local_bfc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c40,local_bf8,uVar1,&local_c41);
      std::operator+(&local_c20,"Validation failed: ",&local_c40);
      DeadlyImportError::DeadlyImportError(this_00,&local_c20);
      local_c55 = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    __assert_fail("iLen > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                  ,0x58,"void Assimp::ValidateDSProcess::ReportError(const char *, ...)");
  }
  __assert_fail("__null != msg",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                ,0x51,"void Assimp::ValidateDSProcess::ReportError(const char *, ...)");
}

Assistant:

AI_WONT_RETURN void ValidateDSProcess::ReportError(const char* msg,...)
{
    ai_assert(NULL != msg);

    va_list args;
    va_start(args,msg);

    char szBuffer[3000];
    const int iLen = vsprintf(szBuffer,msg,args);
    ai_assert(iLen > 0);

    va_end(args);

    throw DeadlyImportError("Validation failed: " + std::string(szBuffer,iLen));
}